

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::Interpreter::Init
          (Error *__return_storage_ptr__,Interpreter *this,string *aConfigFile,string *aRegistryFile
          )

{
  string *this_00;
  int *__pipedes;
  ErrorCode EVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  char *pcVar2;
  Status SVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  JobManager *this_02;
  Registry *pRVar8;
  char *pcVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar10;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  writer write;
  string configJson;
  string verboseEnv;
  undefined1 local_208 [8];
  _Alloc_hider _Stack_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  parse_func local_1e0 [1];
  string local_1d0;
  string *local_1b0;
  ErrorCode local_1a8;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  writer local_178;
  string local_170;
  string local_150;
  Config local_130;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_180 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_180;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_1b0 = aRegistryFile;
  pcVar6 = getenv("VERBOSE");
  pcVar9 = anon_var_dwarf_6dd7b0 + 9;
  if (pcVar6 != (char *)0x0) {
    pcVar9 = pcVar6;
  }
  local_130._0_8_ = &local_130.mLogger;
  sVar7 = strlen(pcVar9);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,pcVar9,pcVar9 + sVar7);
  utils::ToLower(&local_150,(string *)&local_130);
  if ((shared_ptr<ot::commissioner::Logger> *)local_130._0_8_ != &local_130.mLogger) {
    operator_delete((void *)local_130._0_8_);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_130.mDomainName._M_dataplus._M_p = (pointer)&local_130.mDomainName.field_2;
  local_130.mEnableCcm = true;
  local_130.mKeepAliveInterval = 0x28;
  local_130.mMaxConnectionNum = 100;
  local_130.mLogger.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_130.mLogger.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_130.mEnableDtlsDebugLogging = false;
  local_130.mDomainName.field_2._M_allocated_capacity._0_4_ = 0x65726854;
  local_130.mDomainName.field_2._M_allocated_capacity._4_2_ = 0x6461;
  local_130.mDomainName._M_string_length = 6;
  local_130.mDomainName.field_2._M_local_buf[6] = '\0';
  local_130.mId._M_dataplus._M_p = (pointer)&local_130.mId.field_2;
  local_130.mId.field_2._M_allocated_capacity._0_7_ = 0x6d6d6f432d544f;
  local_130.mId.field_2._M_local_buf[7] = 'i';
  local_130.mId.field_2._8_7_ = 0x72656e6f697373;
  local_130.mId._M_string_length = 0xf;
  local_130.mThreadSMRoot._M_dataplus._M_p = (pointer)&local_130.mThreadSMRoot.field_2;
  local_130._103_8_ = 0;
  local_130.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._7_8_ = 0;
  local_130.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._15_8_ = 0;
  local_130._127_8_ = 0;
  local_130.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._7_8_ = 0;
  local_130.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._15_8_ = 0;
  local_130._151_8_ = 0;
  local_130.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._7_8_ = 0;
  local_130.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._15_8_ = 0;
  local_130._175_8_ = 0;
  local_130.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._7_8_ = 0;
  local_130.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._15_8_ = 0;
  local_130._199_8_ = 0;
  local_130.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._7_1_ = 0;
  local_130.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_7_ = 0;
  local_130.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._7_1_ = 0;
  local_130.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130.mThreadSMRoot._M_string_length = 0;
  local_130.mThreadSMRoot.field_2._M_local_buf[0] = '\0';
  if (aConfigFile->_M_string_length == 0) {
    local_130._0_4_ = (uint)(uint3)local_130._1_3_ << 8;
    local_208[0] = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
              (&local_130.mPSKc,0x10,local_208);
    SysLogger::Create((SysLogger *)local_208,kDebug);
    this_01._M_pi =
         local_130.mLogger.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_130.mLogger.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_200._M_p;
    local_130.mLogger.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_208;
    local_208 = (undefined1  [8])0x0;
    _Stack_200._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)this_01._M_pi !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_200._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_200._M_p);
    }
  }
  else {
    ReadFile((Error *)local_208,&local_170,aConfigFile);
    __return_storage_ptr__->mCode = local_208._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_200._M_p != &local_1f0) {
      operator_delete(_Stack_200._M_p);
    }
    if (EVar1 != kNone) goto LAB_001324e0;
    ConfigFromJson((Error *)local_208,&local_130,&local_170);
    __return_storage_ptr__->mCode = local_208._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_200._M_p != &local_1f0) {
      operator_delete(_Stack_200._M_p);
    }
    if (EVar1 != kNone) goto LAB_001324e0;
  }
  LOCK();
  (this->mCancelCommand)._M_base._M_i = false;
  UNLOCK();
  this_02 = (JobManager *)operator_new(0x180);
  JobManager::JobManager(this_02,this);
  std::__shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>::
  reset<ot::commissioner::JobManager>
            (&(this->mJobManager).
              super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>,this_02);
  JobManager::Init((Error *)local_208,
                   (this->mJobManager).
                   super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&local_130);
  __return_storage_ptr__->mCode = local_208._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
  EVar1 = __return_storage_ptr__->mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_200._M_p != &local_1f0) {
    operator_delete(_Stack_200._M_p);
  }
  if (EVar1 != kNone) goto LAB_001324e0;
  pRVar8 = (Registry *)operator_new(0x10);
  persistent_storage::Registry::Registry(pRVar8,local_1b0);
  std::__shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>::
  reset<ot::commissioner::persistent_storage::Registry>
            (&(this->mRegistry).
              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
             ,pRVar8);
  pRVar8 = (this->mRegistry).
           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (pRVar8 == (Registry *)0x0) {
    local_208._0_4_ = kAlreadyExists;
    pcVar9 = "Failed to create registry for file \'{}\'";
    _Stack_200._M_p = "Failed to create registry for file \'{}\'";
    local_1f8 = 0x27;
    local_1f0._M_allocated_capacity = 0x100000000;
    local_1e0[0] = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_1f0._8_8_ = (format_string_checker<char> *)local_208;
    local_178.handler_ = (format_string_checker<char> *)local_208;
    do {
      if (pcVar9 == "") break;
      pcVar6 = pcVar9;
      if (*pcVar9 == '{') {
LAB_0013241a:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&local_178,pcVar9,pcVar6);
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar6,"",(format_string_checker<char> *)local_208);
        bVar10 = true;
      }
      else {
        pcVar6 = pcVar9 + 1;
        bVar10 = pcVar6 != "";
        if (bVar10) {
          if (*pcVar6 != '{') {
            pcVar2 = pcVar9 + 2;
            do {
              pcVar6 = pcVar2;
              bVar10 = pcVar6 != "";
              if (pcVar6 == "") goto LAB_00132416;
              pcVar2 = pcVar6 + 1;
            } while (*pcVar6 != '{');
          }
          bVar10 = true;
        }
LAB_00132416:
        if (bVar10) goto LAB_0013241a;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&local_178,pcVar9,"");
        bVar10 = false;
      }
    } while (bVar10);
    local_208 = (undefined1  [8])(local_1b0->_M_dataplus)._M_p;
    _Stack_200._M_p = (pointer)local_1b0->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x27;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_208;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1d0,(v10 *)"Failed to create registry for file \'{}\'",fmt,args_00);
    local_1a8 = kOutOfMemory;
    local_1a0[0] = local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,local_1d0._M_dataplus._M_p,
               local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
LAB_001324aa:
    __return_storage_ptr__->mCode = local_1a8;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) goto LAB_001324e0;
  }
  else {
    SVar3 = persistent_storage::Registry::Open(pRVar8);
    if (SVar3 != kSuccess) {
      local_208 = (undefined1  [8])((ulong)local_208 & 0xffffffff00000000);
      _Stack_200._M_p = "registry failed to open";
      local_1f8 = 0x17;
      local_1f0._M_allocated_capacity = 0;
      local_1e0[0] = (parse_func)0x0;
      pcVar9 = "registry failed to open";
      local_1f0._8_8_ = (format_string_checker<char> *)local_208;
      do {
        pcVar6 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar9,"",(format_string_checker<char> *)local_208);
        }
        pcVar9 = pcVar6;
      } while (pcVar6 != "");
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_208;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1d0,(v10 *)"registry failed to open",(string_view)ZEXT816(0x17),args);
      local_1a8 = kRegistryError;
      local_1a0[0] = local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,local_1d0._M_dataplus._M_p,
                 local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
      goto LAB_001324aa;
    }
    __pipedes = this->mCancelPipe;
    iVar4 = pipe(__pipedes);
    if (iVar4 == -1) {
      local_208 = (undefined1  [8])((ulong)local_208 & 0xffffffff00000000);
      pcVar9 = "failed to initialize command cancellation structures";
      _Stack_200._M_p = "failed to initialize command cancellation structures";
      local_1f8 = 0x34;
      local_1f0._M_allocated_capacity = 0;
      local_1e0[0] = (parse_func)0x0;
      local_1f0._8_8_ = (format_string_checker<char> *)local_208;
      local_178.handler_ = (format_string_checker<char> *)local_208;
      do {
        if (pcVar9 == "") break;
        pcVar6 = pcVar9;
        if (*pcVar9 == '{') {
LAB_001326ab:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_178,pcVar9,pcVar6);
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar6,"",(format_string_checker<char> *)local_208);
          bVar10 = true;
        }
        else {
          pcVar6 = pcVar9 + 1;
          bVar10 = pcVar6 != "";
          if (bVar10) {
            if (*pcVar6 != '{') {
              pcVar2 = pcVar9 + 2;
              do {
                pcVar6 = pcVar2;
                bVar10 = pcVar6 != "";
                if (pcVar6 == "") goto LAB_001326a7;
                pcVar2 = pcVar6 + 1;
              } while (*pcVar6 != '{');
            }
            bVar10 = true;
          }
LAB_001326a7:
          if (bVar10) goto LAB_001326ab;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_178,pcVar9,"");
          bVar10 = false;
        }
      } while (bVar10);
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_208;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1d0,(v10 *)"failed to initialize command cancellation structures",
                 (string_view)ZEXT816(0x34),args_01);
      local_1a8 = kIOError;
      local_1a0[0] = local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,local_1d0._M_dataplus._M_p,
                 local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
      goto LAB_001324aa;
    }
    uVar5 = fcntl(*__pipedes,3,0);
    fcntl(*__pipedes,4,(ulong)(uVar5 | 0x800));
    uVar5 = fcntl(this->mCancelPipe[1],3,0);
    fcntl(this->mCancelPipe[1],4,(ulong)(uVar5 | 0x800));
    iVar4 = std::__cxx11::string::compare((char *)&local_150);
    bVar10 = true;
    if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_150), iVar4 != 0)) {
      iVar4 = std::__cxx11::string::compare((char *)&local_150);
      bVar10 = iVar4 == 0;
    }
    gVerbose = bVar10;
    UpdateNetworkSelectionInfo((Error *)local_208,this,true);
    __return_storage_ptr__->mCode = local_208._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
    local_1d0._M_dataplus._M_p = _Stack_200._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_200._M_p == &local_1f0) goto LAB_001324e0;
  }
  operator_delete(local_1d0._M_dataplus._M_p);
LAB_001324e0:
  Config::~Config(&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::Init(const std::string &aConfigFile, const std::string &aRegistryFile)
{
    Error error;

    std::string verboseEnv = ToLower(SafeStr(getenv("VERBOSE")));
    std::string configJson;
    Config      config;

    if (!aConfigFile.empty())
    {
        SuccessOrExit(error = ReadFile(configJson, aConfigFile));
        SuccessOrExit(error = ConfigFromJson(config, configJson));
    }
    else
    {
        // Default to Non-CCM mode if no configuration file is provided.
        config.mEnableCcm = false;
        config.mPSKc.assign(kMaxPSKcLength, 0xff);
        config.mLogger = SysLogger::Create(LogLevel::kDebug);
    }

    int flags;

    mCancelCommand = false;

    mJobManager.reset(new JobManager(*this));
    SuccessOrExit(error = mJobManager->Init(config));
    mRegistry.reset(new Registry(aRegistryFile));
    VerifyOrExit(mRegistry != nullptr,
                 error = ERROR_OUT_OF_MEMORY("Failed to create registry for file '{}'", aRegistryFile));
    VerifyOrExit(mRegistry->Open() == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("registry failed to open"));

    VerifyOrExit(pipe(mCancelPipe) != -1,
                 error = ERROR_IO_ERROR("failed to initialize command cancellation structures"));
    // set both pipe FDs non-blocking
    flags = fcntl(mCancelPipe[0], F_GETFL, 0);
    fcntl(mCancelPipe[0], F_SETFL, flags | O_NONBLOCK);
    flags = fcntl(mCancelPipe[1], F_GETFL, 0);
    fcntl(mCancelPipe[1], F_SETFL, flags | O_NONBLOCK);
    // set up console verbosity
    gVerbose = verboseEnv == "1" || verboseEnv == "yes" || verboseEnv == "true";
    error    = UpdateNetworkSelectionInfo(true);
exit:
    return error;
}